

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O2

string * commify(string *__return_storage_ptr__,string *data)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  string result;
  
  uVar4 = 0;
  uVar8 = (uint)data->_M_string_length;
  uVar5 = 0;
  if (0 < (int)uVar8) {
    uVar5 = data->_M_string_length & 0xffffffff;
  }
  uVar1 = 0xffffffffffffffff;
  uVar2 = 0xffffffff;
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    iVar6 = (int)(data->_M_dataplus)._M_p[uVar4];
    if (iVar6 - 0x30U < 10) {
      uVar2 = uVar4 & 0xffffffff;
    }
    if (iVar6 == 0x2e) {
      uVar1 = uVar4;
    }
    uVar1 = uVar1 & 0xffffffff;
  }
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  uVar4 = (ulong)(int)uVar8;
  if ((int)uVar1 == -1) {
    while (uVar4 = uVar4 - 1, (long)(int)uVar2 < (long)uVar4) {
      std::__cxx11::string::push_back((char)&result);
    }
    iVar6 = 0;
    while (iVar7 = (int)uVar4, -1 < iVar7) {
      cVar3 = (char)&result;
      if ((int)(data->_M_dataplus)._M_p[uVar4 & 0xffffffff] - 0x30U < 10) {
        std::__cxx11::string::push_back(cVar3);
        iVar6 = iVar6 + 1;
        if (iVar7 != 0 && iVar6 == 3) {
          iVar6 = 3;
          if ((int)(data->_M_dataplus)._M_p[(uVar4 & 0xffffffff) - 1] - 0x30U < 10) {
            iVar6 = 0;
            std::__cxx11::string::push_back(cVar3);
          }
        }
      }
      else {
        std::__cxx11::string::push_back(cVar3);
      }
      uVar4 = (ulong)(iVar7 - 1);
    }
  }
  else {
    for (; uVar8 = uVar8 - 1, (long)(int)uVar1 < (long)uVar4; uVar4 = uVar4 - 1) {
      std::__cxx11::string::push_back((char)&result);
    }
    iVar6 = 0;
    for (; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      cVar3 = (char)&result;
      if ((int)(data->_M_dataplus)._M_p[uVar8] - 0x30U < 10) {
        std::__cxx11::string::push_back(cVar3);
        iVar6 = iVar6 + 1;
        if (uVar8 != 0 && iVar6 == 3) {
          iVar6 = 3;
          if ((int)(data->_M_dataplus)._M_p[(ulong)uVar8 - 1] - 0x30U < 10) {
            iVar6 = 0;
            std::__cxx11::string::push_back(cVar3);
          }
        }
      }
      else {
        std::__cxx11::string::push_back(cVar3);
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (iVar6 = (int)result._M_string_length; 0 < iVar6; iVar6 = iVar6 + -1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string commify (const std::string& data)
{
  // First scan for decimal point and end of digits.
  int decimalPoint = -1;
  int end          = -1;

  int i;
  for (int i = 0; i < (int) data.length (); ++i)
  {
    if (isdigit (data[i]))
      end = i;

    if (data[i] == '.')
      decimalPoint = i;
  }

  std::string result;
  if (decimalPoint != -1)
  {
    // In reverse order, transfer all digits up to, and including the decimal
    // point.
    for (i = (int) data.length () - 1; i >= decimalPoint; --i)
      result += data[i];

    int consecutiveDigits = 0;
    for (; i >= 0; --i)
    {
      if (isdigit (data[i]))
      {
        result += data[i];

        if (++consecutiveDigits == 3 && i && isdigit (data[i - 1]))
        {
          result += ',';
          consecutiveDigits = 0;
        }
      }
      else
        result += data[i];
    }
  }
  else
  {
    // In reverse order, transfer all digits up to, but not including the last
    // digit.
    for (i = (int) data.length () - 1; i > end; --i)
      result += data[i];

    int consecutiveDigits = 0;
    for (; i >= 0; --i)
    {
      if (isdigit (data[i]))
      {
        result += data[i];

        if (++consecutiveDigits == 3 && i && isdigit (data[i - 1]))
        {
          result += ',';
          consecutiveDigits = 0;
        }
      }
      else
        result += data[i];
    }
  }

  // reverse result into data.
  std::string done;
  for (int i = (int) result.length () - 1; i >= 0; --i)
    done += result[i];

  return done;
}